

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O2

vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_> *
__thiscall
TestChain100Setup::PopulateMempool
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *__return_storage_ptr__,TestChain100Setup *this,FastRandomContext *det_rand,
          size_t num_transactions,bool submit)

{
  uint32_t uVar1;
  pointer psVar2;
  element_type *peVar3;
  CTxMemPool *this_00;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  size_type range;
  unsigned_long __n;
  reference ppVar8;
  size_t n;
  long lVar9;
  ulong uVar10;
  _Elt_pointer ppVar11;
  size_t n_1;
  ulong uVar12;
  pointer psVar13;
  long lVar14;
  long in_FS_OFFSET;
  bool bVar15;
  CTransactionRef ptx;
  CAmount amount_per_output;
  CMutableTransaction mtx;
  deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_> unspent_prevouts;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CScript spk;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::
  _Deque_base(&unspent_prevouts.
               super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
             );
  psVar2 = (this->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar13 = (this->m_coinbase_txns).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar13 != psVar2; psVar13 = psVar13 + 1
      ) {
    peVar3 = (psVar13->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    spk.super_CScriptBase._union.indirect_contents.indirect =
         (char *)*(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    spk.super_CScriptBase._union._8_8_ =
         *(undefined8 *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    spk.super_CScriptBase._union._16_8_ =
         *(undefined8 *)
          ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    spk.super_CScriptBase._24_8_ =
         *(undefined8 *)
          ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    std::deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>>::
    emplace_back<std::pair<COutPoint,long>>
              ((deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>> *)
               &unspent_prevouts,(pair<COutPoint,_long> *)&spk);
  }
  while ((num_transactions != 0 &&
         (unspent_prevouts.
          super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          unspent_prevouts.
          super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur))) {
    CMutableTransaction::CMutableTransaction(&mtx);
    iVar7 = RandomMixin<FastRandomContext>::randrange<int>
                      (&det_rand->super_RandomMixin<FastRandomContext>,0x18);
    lVar9 = (long)(iVar7 + 1);
    lVar14 = 0;
    while ((ppVar11 = unspent_prevouts.
                      super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur, bVar15 = lVar9 != 0,
           lVar9 = lVar9 + -1, bVar15 &&
           (unspent_prevouts.
            super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            unspent_prevouts.
            super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur))) {
      spk.super_CScriptBase._union._16_8_ = 0;
      spk.super_CScriptBase._24_8_ = 0;
      spk.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
      spk.super_CScriptBase._union._8_8_ = 0;
      std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint_const&,CScript>
                ((vector<CTxIn,std::allocator<CTxIn>> *)&mtx,
                 &(unspent_prevouts.
                   super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur)->first,&spk);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&spk);
      lVar14 = lVar14 + ppVar11->second;
      std::deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::
      pop_front(&unspent_prevouts);
    }
    iVar7 = RandomMixin<FastRandomContext>::randrange<int>
                      (&det_rand->super_RandomMixin<FastRandomContext>,0x18);
    uVar12 = (ulong)(iVar7 + 1);
    iVar7 = RandomMixin<FastRandomContext>::randrange<int>
                      (&det_rand->super_RandomMixin<FastRandomContext>,0x1e);
    amount_per_output = (ulong)(lVar14 - iVar7 * 100) / uVar12;
    for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
      local_58._16_4_ = 0;
      local_58._20_4_ = 0;
      local_58._24_8_ = 0;
      local_58._0_4_ = 0;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(uVar10 + num_transactions);
      other = &CScript::operator<<((CScript *)local_58,(CScriptNum *)&ptx)->super_CScriptBase;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&spk,other);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
      std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript&>
                ((vector<CTxOut,std::allocator<CTxOut>> *)&mtx.vout,&amount_per_output,&spk);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&spk);
    }
    std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&ptx);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&ptx);
    if (3000 < amount_per_output) {
      for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        spk.super_CScriptBase._union.indirect_contents.indirect =
             (char *)*(undefined8 *)
                      ((ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        spk.super_CScriptBase._union._8_8_ =
             *(undefined8 *)
              (((ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        spk.super_CScriptBase._union._16_8_ =
             *(undefined8 *)
              (((ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        spk.super_CScriptBase._24_8_ =
             *(undefined8 *)
              (((ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        std::deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>>::
        emplace_back<COutPoint,long_const&>
                  ((deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>> *)
                   &unspent_prevouts,(COutPoint *)&spk,&amount_per_output);
        ppVar11 = unspent_prevouts.
                  super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (unspent_prevouts.
            super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            unspent_prevouts.
            super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar11 = unspent_prevouts.
                    super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
        }
        range = std::deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                ::size(&unspent_prevouts);
        __n = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                        (&det_rand->super_RandomMixin<FastRandomContext>,range);
        ppVar8 = std::
                 _Deque_iterator<std::pair<COutPoint,_long>,_std::pair<COutPoint,_long>_&,_std::pair<COutPoint,_long>_*>
                 ::operator[](&unspent_prevouts.
                               super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                               ._M_impl.super__Deque_impl_data._M_start,__n);
        uVar1 = ppVar11[-1].first.n;
        spk.super_CScriptBase._union.indirect_contents.indirect =
             (char *)*(undefined8 *)
                      ppVar11[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
        spk.super_CScriptBase._union._8_8_ =
             *(undefined8 *)
              (ppVar11[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        spk.super_CScriptBase._union._16_8_ =
             *(undefined8 *)
              (ppVar11[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        spk.super_CScriptBase._24_8_ =
             *(undefined8 *)
              (ppVar11[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        ppVar11[-1].first.n = (ppVar8->first).n;
        uVar4 = *(undefined8 *)(ppVar8->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar5 = *(undefined8 *)
                 ((ppVar8->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar6 = *(undefined8 *)
                 ((ppVar8->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        *(undefined8 *)
         (ppVar11[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
             *(undefined8 *)
              ((ppVar8->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        *(undefined8 *)
         (ppVar11[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar6;
        *(undefined8 *)ppVar11[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
             uVar4;
        *(undefined8 *)(ppVar11[-1].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
             = uVar5;
        (ppVar8->first).n = uVar1;
        *(undefined8 *)((ppVar8->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
             = spk.super_CScriptBase._union._16_8_;
        *(undefined8 *)((ppVar8->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
             = spk.super_CScriptBase._24_8_;
        *(undefined8 *)(ppVar8->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
             spk.super_CScriptBase._union.indirect_contents.indirect;
        *(undefined8 *)((ppVar8->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
             spk.super_CScriptBase._union._8_8_;
        lVar9 = ppVar11[-1].second;
        ppVar11[-1].second = ppVar8->second;
        ppVar8->second = lVar9;
      }
    }
    if (submit) {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock1,&cs_main,"cs_main",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                 ,0x21c,false);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock2,
                 &((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node
                   .mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                   ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                   super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs,"m_node.mempool->cs"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                 ,0x21c,false);
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      local_58._16_4_ = 0;
      this_00 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>.
                _M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
      CTxMemPoolEntry::CTxMemPoolEntry
                ((CTxMemPoolEntry *)&spk,&ptx,lVar14 - uVar12 * amount_per_output,0,1,0,false,4,
                 (LockPoints)(ZEXT424((uint)local_58._0_4_) << 0x20));
      CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&spk);
      CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&spk);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    CMutableTransaction::~CMutableTransaction(&mtx);
    num_transactions = num_transactions - 1;
  }
  std::_Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::
  ~_Deque_base(&unspent_prevouts.
                super__Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
              );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CTransactionRef> TestChain100Setup::PopulateMempool(FastRandomContext& det_rand, size_t num_transactions, bool submit)
{
    std::vector<CTransactionRef> mempool_transactions;
    std::deque<std::pair<COutPoint, CAmount>> unspent_prevouts;
    std::transform(m_coinbase_txns.begin(), m_coinbase_txns.end(), std::back_inserter(unspent_prevouts),
        [](const auto& tx){ return std::make_pair(COutPoint(tx->GetHash(), 0), tx->vout[0].nValue); });
    while (num_transactions > 0 && !unspent_prevouts.empty()) {
        // The number of inputs and outputs are random, between 1 and 24.
        CMutableTransaction mtx = CMutableTransaction();
        const size_t num_inputs = det_rand.randrange(24) + 1;
        CAmount total_in{0};
        for (size_t n{0}; n < num_inputs; ++n) {
            if (unspent_prevouts.empty()) break;
            const auto& [prevout, amount] = unspent_prevouts.front();
            mtx.vin.emplace_back(prevout, CScript());
            total_in += amount;
            unspent_prevouts.pop_front();
        }
        const size_t num_outputs = det_rand.randrange(24) + 1;
        const CAmount fee = 100 * det_rand.randrange(30);
        const CAmount amount_per_output = (total_in - fee) / num_outputs;
        for (size_t n{0}; n < num_outputs; ++n) {
            CScript spk = CScript() << CScriptNum(num_transactions + n);
            mtx.vout.emplace_back(amount_per_output, spk);
        }
        CTransactionRef ptx = MakeTransactionRef(mtx);
        mempool_transactions.push_back(ptx);
        if (amount_per_output > 3000) {
            // If the value is high enough to fund another transaction + fees, keep track of it so
            // it can be used to build a more complex transaction graph. Insert randomly into
            // unspent_prevouts for extra randomness in the resulting structures.
            for (size_t n{0}; n < num_outputs; ++n) {
                unspent_prevouts.emplace_back(COutPoint(ptx->GetHash(), n), amount_per_output);
                std::swap(unspent_prevouts.back(), unspent_prevouts[det_rand.randrange(unspent_prevouts.size())]);
            }
        }
        if (submit) {
            LOCK2(cs_main, m_node.mempool->cs);
            LockPoints lp;
            m_node.mempool->addUnchecked(CTxMemPoolEntry(ptx, /*fee=*/(total_in - num_outputs * amount_per_output),
                                                         /*time=*/0, /*entry_height=*/1, /*entry_sequence=*/0,
                                                         /*spends_coinbase=*/false, /*sigops_cost=*/4, lp));
        }
        --num_transactions;
    }
    return mempool_transactions;
}